

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

QRegion __thiscall QRegion::intersected(QRegion *this,QRect *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QRegionPrivate *this_00;
  int *piVar5;
  QRect QVar6;
  QRect QVar7;
  bool bVar8;
  QRect *in_RDX;
  long in_FS_OFFSET;
  QRect local_48;
  QRect local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QRegionPrivate **)(*(long *)r + 8);
  if ((this_00 != (QRegionPrivate *)0x0) && (this_00->numRects != 0)) {
    iVar1 = (in_RDX->x1).m_i;
    iVar2 = (in_RDX->y1).m_i;
    iVar3 = (in_RDX->x2).m_i;
    iVar4 = (in_RDX->y2).m_i;
    if (((iVar2 <= iVar4 && iVar1 <= iVar3) &&
        (((iVar1 <= (this_00->extents).x2.m_i && ((this_00->extents).x1.m_i <= iVar3)) &&
         (iVar2 <= (this_00->extents).y2.m_i)))) && ((this_00->extents).y1.m_i <= iVar4)) {
      bVar8 = QRegionPrivate::within(this_00,in_RDX);
      QVar6.x2.m_i = local_48.x2.m_i;
      QVar6.y2.m_i = local_48.y2.m_i;
      QVar6.x1.m_i = local_48.x1.m_i;
      QVar6.y1.m_i = local_48.y1.m_i;
      if (bVar8) {
        local_48 = QVar6;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          QRegion(this,(QRegion *)r);
          return (QRegion)(QRegionData *)this;
        }
      }
      else {
        bVar8 = QRegionPrivate::contains(*(QRegionPrivate **)(*(long *)r + 8),in_RDX);
        QVar7.x2.m_i = local_48.x2.m_i;
        QVar7.y2.m_i = local_48.y2.m_i;
        QVar7.x1.m_i = local_48.x1.m_i;
        QVar7.y1.m_i = local_48.y1.m_i;
        if (bVar8) {
          local_48 = QVar7;
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            QRegion(this,in_RDX,Rectangle);
            return (QRegion)(QRegionData *)this;
          }
        }
        else {
          piVar5 = *(int **)(*(long *)r + 8);
          if (*piVar5 == 1) {
            local_48 = (QRect)QRect::normalized();
            local_38 = qt_rect_intersect_normalized((QRect *)(piVar5 + 8),&local_48);
            QRegion(this,&local_38,Rectangle);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              return (QRegion)(QRegionData *)this;
            }
          }
          else {
            this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion(this,(QRegion *)r);
            detach(this);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              QRegionPrivate::intersect(this->d->qt_rgn,in_RDX);
              return (QRegion)(QRegionData *)this;
            }
          }
        }
      }
      goto LAB_003d104e;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QRegion(this);
    return (QRegion)(QRegionData *)this;
  }
LAB_003d104e:
  __stack_chk_fail();
}

Assistant:

QRegion QRegion::intersected(const QRect &r) const
{
    if (isEmptyHelper(d->qt_rgn) || r.isEmpty()
        || !EXTENTCHECK(&d->qt_rgn->extents, &r))
        return QRegion();

    /* this is fully contained in r */
    if (d->qt_rgn->within(r))
        return *this;

    /* r is fully contained in this */
    if (d->qt_rgn->contains(r))
        return r;

    if (d->qt_rgn->numRects == 1) {
        const QRect rect = qt_rect_intersect_normalized(d->qt_rgn->extents,
                                                        r.normalized());
        return QRegion(rect);
    }

    QRegion result(*this);
    result.detach();
    result.d->qt_rgn->intersect(r);
    return result;
}